

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

void __thiscall Assimp::FBX::FBXConverter::ConvertGlobalSettings(FBXConverter *this)

{
  char *pcVar1;
  aiScene *paVar2;
  FileGlobalSettings *pFVar3;
  int iVar4;
  FrameRate FVar5;
  aiMetadata *paVar6;
  aiString *paVar7;
  aiMetadataEntry *__s;
  int *piVar8;
  double *pdVar9;
  undefined4 *puVar10;
  undefined8 *puVar11;
  FrameRate *pFVar12;
  uint64_t uVar13;
  uint64_t *puVar14;
  long lVar15;
  ulong uVar16;
  float fVar17;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  aiVector3D aVar18;
  long *local_68;
  ulong local_60;
  long local_58 [2];
  undefined1 local_48 [16];
  float local_34;
  
  paVar2 = this->out;
  if (paVar2 == (aiScene *)0x0) {
    return;
  }
  paVar6 = (aiMetadata *)operator_new(0x18);
  paVar6->mKeys = (aiString *)0x0;
  paVar6->mValues = (aiMetadataEntry *)0x0;
  paVar6->mNumProperties = 0xf;
  paVar7 = (aiString *)operator_new__(0x3c3c);
  lVar15 = 5;
  do {
    pcVar1 = paVar7->data + lVar15 + -9;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    paVar7->data[lVar15 + -5] = '\0';
    memset(paVar7->data + lVar15 + -4,0x1b,0x3ff);
    lVar15 = lVar15 + 0x404;
  } while (lVar15 != 0x3c41);
  paVar6->mKeys = paVar7;
  uVar16 = (ulong)paVar6->mNumProperties << 4;
  __s = (aiMetadataEntry *)operator_new__(uVar16);
  memset(__s,0,uVar16);
  paVar6->mValues = __s;
  paVar2->mMetaData = paVar6;
  paVar6 = this->out->mMetaData;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"UpAxis","");
  pFVar3 = (this->doc->globals)._M_t.
           super___uniq_ptr_impl<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
           ._M_t.
           super__Tuple_impl<0UL,_Assimp::FBX::FileGlobalSettings_*,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
           .super__Head_base<0UL,_Assimp::FBX::FileGlobalSettings_*,_false>._M_head_impl;
  if (pFVar3 != (FileGlobalSettings *)0x0) {
    iVar4 = FileGlobalSettings::UpAxis(pFVar3);
    uVar16 = local_60;
    if ((paVar6->mNumProperties != 0) && (local_60 != 0)) {
      if (local_60 < 0x400) {
        paVar7 = paVar6->mKeys;
        paVar7->length = (ai_uint32)local_60;
        memcpy(paVar7->data,local_68,local_60);
        paVar7->data[uVar16] = '\0';
      }
      paVar6->mValues->mType = AI_INT32;
      piVar8 = (int *)operator_new(4);
      *piVar8 = iVar4;
      paVar6->mValues->mData = piVar8;
    }
    if (local_68 != local_58) {
      operator_delete(local_68,local_58[0] + 1);
    }
    paVar6 = this->out->mMetaData;
    local_68 = local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"UpAxisSign","");
    pFVar3 = (this->doc->globals)._M_t.
             super___uniq_ptr_impl<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
             ._M_t.
             super__Tuple_impl<0UL,_Assimp::FBX::FileGlobalSettings_*,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
             .super__Head_base<0UL,_Assimp::FBX::FileGlobalSettings_*,_false>._M_head_impl;
    if (pFVar3 != (FileGlobalSettings *)0x0) {
      iVar4 = FileGlobalSettings::UpAxisSign(pFVar3);
      uVar16 = local_60;
      if ((1 < paVar6->mNumProperties) && (local_60 != 0)) {
        if (local_60 < 0x400) {
          paVar7 = paVar6->mKeys;
          paVar7[1].length = (ai_uint32)local_60;
          memcpy(paVar7[1].data,local_68,local_60);
          paVar7[1].data[uVar16] = '\0';
        }
        paVar6->mValues[1].mType = AI_INT32;
        piVar8 = (int *)operator_new(4);
        *piVar8 = iVar4;
        paVar6->mValues[1].mData = piVar8;
      }
      if (local_68 != local_58) {
        operator_delete(local_68,local_58[0] + 1);
      }
      paVar6 = this->out->mMetaData;
      local_68 = local_58;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"FrontAxis","");
      pFVar3 = (this->doc->globals)._M_t.
               super___uniq_ptr_impl<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
               ._M_t.
               super__Tuple_impl<0UL,_Assimp::FBX::FileGlobalSettings_*,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
               .super__Head_base<0UL,_Assimp::FBX::FileGlobalSettings_*,_false>._M_head_impl;
      if (pFVar3 != (FileGlobalSettings *)0x0) {
        iVar4 = FileGlobalSettings::FrontAxis(pFVar3);
        uVar16 = local_60;
        if ((2 < paVar6->mNumProperties) && (local_60 != 0)) {
          if (local_60 < 0x400) {
            paVar7 = paVar6->mKeys;
            paVar7[2].length = (ai_uint32)local_60;
            memcpy(paVar7[2].data,local_68,local_60);
            paVar7[2].data[uVar16] = '\0';
          }
          paVar6->mValues[2].mType = AI_INT32;
          piVar8 = (int *)operator_new(4);
          *piVar8 = iVar4;
          paVar6->mValues[2].mData = piVar8;
        }
        if (local_68 != local_58) {
          operator_delete(local_68,local_58[0] + 1);
        }
        paVar6 = this->out->mMetaData;
        local_68 = local_58;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"FrontAxisSign","");
        pFVar3 = (this->doc->globals)._M_t.
                 super___uniq_ptr_impl<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Assimp::FBX::FileGlobalSettings_*,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                 .super__Head_base<0UL,_Assimp::FBX::FileGlobalSettings_*,_false>._M_head_impl;
        if (pFVar3 != (FileGlobalSettings *)0x0) {
          iVar4 = FileGlobalSettings::FrontAxisSign(pFVar3);
          uVar16 = local_60;
          if ((3 < paVar6->mNumProperties) && (local_60 != 0)) {
            if (local_60 < 0x400) {
              paVar7 = paVar6->mKeys;
              paVar7[3].length = (ai_uint32)local_60;
              memcpy(paVar7[3].data,local_68,local_60);
              paVar7[3].data[uVar16] = '\0';
            }
            paVar6->mValues[3].mType = AI_INT32;
            piVar8 = (int *)operator_new(4);
            *piVar8 = iVar4;
            paVar6->mValues[3].mData = piVar8;
          }
          if (local_68 != local_58) {
            operator_delete(local_68,local_58[0] + 1);
          }
          paVar6 = this->out->mMetaData;
          local_68 = local_58;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"CoordAxis","");
          pFVar3 = (this->doc->globals)._M_t.
                   super___uniq_ptr_impl<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Assimp::FBX::FileGlobalSettings_*,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                   .super__Head_base<0UL,_Assimp::FBX::FileGlobalSettings_*,_false>._M_head_impl;
          if (pFVar3 != (FileGlobalSettings *)0x0) {
            iVar4 = FileGlobalSettings::CoordAxis(pFVar3);
            uVar16 = local_60;
            if ((4 < paVar6->mNumProperties) && (local_60 != 0)) {
              if (local_60 < 0x400) {
                paVar7 = paVar6->mKeys;
                paVar7[4].length = (ai_uint32)local_60;
                memcpy(paVar7[4].data,local_68,local_60);
                paVar7[4].data[uVar16] = '\0';
              }
              paVar6->mValues[4].mType = AI_INT32;
              piVar8 = (int *)operator_new(4);
              *piVar8 = iVar4;
              paVar6->mValues[4].mData = piVar8;
            }
            if (local_68 != local_58) {
              operator_delete(local_68,local_58[0] + 1);
            }
            paVar6 = this->out->mMetaData;
            local_68 = local_58;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"CoordAxisSign","");
            pFVar3 = (this->doc->globals)._M_t.
                     super___uniq_ptr_impl<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Assimp::FBX::FileGlobalSettings_*,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                     .super__Head_base<0UL,_Assimp::FBX::FileGlobalSettings_*,_false>._M_head_impl;
            if (pFVar3 != (FileGlobalSettings *)0x0) {
              iVar4 = FileGlobalSettings::CoordAxisSign(pFVar3);
              uVar16 = local_60;
              if ((5 < paVar6->mNumProperties) && (local_60 != 0)) {
                if (local_60 < 0x400) {
                  paVar7 = paVar6->mKeys;
                  paVar7[5].length = (ai_uint32)local_60;
                  memcpy(paVar7[5].data,local_68,local_60);
                  paVar7[5].data[uVar16] = '\0';
                }
                paVar6->mValues[5].mType = AI_INT32;
                piVar8 = (int *)operator_new(4);
                *piVar8 = iVar4;
                paVar6->mValues[5].mData = piVar8;
              }
              if (local_68 != local_58) {
                operator_delete(local_68,local_58[0] + 1);
              }
              paVar6 = this->out->mMetaData;
              local_68 = local_58;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_68,"OriginalUpAxis","");
              pFVar3 = (this->doc->globals)._M_t.
                       super___uniq_ptr_impl<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Assimp::FBX::FileGlobalSettings_*,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                       .super__Head_base<0UL,_Assimp::FBX::FileGlobalSettings_*,_false>._M_head_impl
              ;
              if (pFVar3 != (FileGlobalSettings *)0x0) {
                iVar4 = FileGlobalSettings::OriginalUpAxis(pFVar3);
                uVar16 = local_60;
                if ((6 < paVar6->mNumProperties) && (local_60 != 0)) {
                  if (local_60 < 0x400) {
                    paVar7 = paVar6->mKeys;
                    paVar7[6].length = (ai_uint32)local_60;
                    memcpy(paVar7[6].data,local_68,local_60);
                    paVar7[6].data[uVar16] = '\0';
                  }
                  paVar6->mValues[6].mType = AI_INT32;
                  piVar8 = (int *)operator_new(4);
                  *piVar8 = iVar4;
                  paVar6->mValues[6].mData = piVar8;
                }
                if (local_68 != local_58) {
                  operator_delete(local_68,local_58[0] + 1);
                }
                paVar6 = this->out->mMetaData;
                local_68 = local_58;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_68,"OriginalUpAxisSign","");
                pFVar3 = (this->doc->globals)._M_t.
                         super___uniq_ptr_impl<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Assimp::FBX::FileGlobalSettings_*,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                         .super__Head_base<0UL,_Assimp::FBX::FileGlobalSettings_*,_false>.
                         _M_head_impl;
                if (pFVar3 != (FileGlobalSettings *)0x0) {
                  iVar4 = FileGlobalSettings::OriginalUpAxisSign(pFVar3);
                  uVar16 = local_60;
                  if ((7 < paVar6->mNumProperties) && (local_60 != 0)) {
                    if (local_60 < 0x400) {
                      paVar7 = paVar6->mKeys;
                      paVar7[7].length = (ai_uint32)local_60;
                      memcpy(paVar7[7].data,local_68,local_60);
                      paVar7[7].data[uVar16] = '\0';
                    }
                    paVar6->mValues[7].mType = AI_INT32;
                    piVar8 = (int *)operator_new(4);
                    *piVar8 = iVar4;
                    paVar6->mValues[7].mData = piVar8;
                  }
                  if (local_68 != local_58) {
                    operator_delete(local_68,local_58[0] + 1);
                  }
                  paVar6 = this->out->mMetaData;
                  local_68 = local_58;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_68,"UnitScaleFactor","");
                  pFVar3 = (this->doc->globals)._M_t.
                           super___uniq_ptr_impl<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Assimp::FBX::FileGlobalSettings_*,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                           .super__Head_base<0UL,_Assimp::FBX::FileGlobalSettings_*,_false>.
                           _M_head_impl;
                  if (pFVar3 != (FileGlobalSettings *)0x0) {
                    fVar17 = FileGlobalSettings::UnitScaleFactor(pFVar3);
                    uVar16 = local_60;
                    if ((8 < paVar6->mNumProperties) && (local_60 != 0)) {
                      local_48._0_4_ = fVar17;
                      if (local_60 < 0x400) {
                        paVar7 = paVar6->mKeys;
                        paVar7[8].length = (ai_uint32)local_60;
                        memcpy(paVar7[8].data,local_68,local_60);
                        paVar7[8].data[uVar16] = '\0';
                      }
                      paVar6->mValues[8].mType = AI_DOUBLE;
                      pdVar9 = (double *)operator_new(8);
                      *pdVar9 = (double)(float)local_48._0_4_;
                      paVar6->mValues[8].mData = pdVar9;
                    }
                    if (local_68 != local_58) {
                      operator_delete(local_68,local_58[0] + 1);
                    }
                    paVar6 = this->out->mMetaData;
                    local_68 = local_58;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_68,"OriginalUnitScaleFactor","");
                    pFVar3 = (this->doc->globals)._M_t.
                             super___uniq_ptr_impl<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Assimp::FBX::FileGlobalSettings_*,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                             .super__Head_base<0UL,_Assimp::FBX::FileGlobalSettings_*,_false>.
                             _M_head_impl;
                    if (pFVar3 != (FileGlobalSettings *)0x0) {
                      fVar17 = FileGlobalSettings::OriginalUnitScaleFactor(pFVar3);
                      uVar16 = local_60;
                      if ((9 < paVar6->mNumProperties) && (local_60 != 0)) {
                        local_48._0_4_ = fVar17;
                        if (local_60 < 0x400) {
                          paVar7 = paVar6->mKeys;
                          paVar7[9].length = (ai_uint32)local_60;
                          memcpy(paVar7[9].data,local_68,local_60);
                          paVar7[9].data[uVar16] = '\0';
                        }
                        paVar6->mValues[9].mType = AI_FLOAT;
                        puVar10 = (undefined4 *)operator_new(4);
                        *puVar10 = local_48._0_4_;
                        paVar6->mValues[9].mData = puVar10;
                      }
                      if (local_68 != local_58) {
                        operator_delete(local_68,local_58[0] + 1);
                      }
                      paVar6 = this->out->mMetaData;
                      local_68 = local_58;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_68,"AmbientColor","");
                      pFVar3 = (this->doc->globals)._M_t.
                               super___uniq_ptr_impl<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_Assimp::FBX::FileGlobalSettings_*,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                               .super__Head_base<0UL,_Assimp::FBX::FileGlobalSettings_*,_false>.
                               _M_head_impl;
                      if (pFVar3 != (FileGlobalSettings *)0x0) {
                        aVar18 = FileGlobalSettings::AmbientColor(pFVar3);
                        uVar16 = local_60;
                        if ((10 < paVar6->mNumProperties) && (local_60 != 0)) {
                          local_48._8_4_ = extraout_XMM0_Dc;
                          local_48._0_8_ = aVar18._0_8_;
                          local_48._12_4_ = extraout_XMM0_Dd;
                          local_34 = aVar18.z;
                          if (local_60 < 0x400) {
                            paVar7 = paVar6->mKeys;
                            paVar7[10].length = (ai_uint32)local_60;
                            memcpy(paVar7[10].data,local_68,local_60);
                            paVar7[10].data[uVar16] = '\0';
                          }
                          paVar6->mValues[10].mType = AI_AIVECTOR3D;
                          puVar11 = (undefined8 *)operator_new(0xc);
                          *puVar11 = local_48._0_8_;
                          *(float *)(puVar11 + 1) = local_34;
                          paVar6->mValues[10].mData = puVar11;
                        }
                        if (local_68 != local_58) {
                          operator_delete(local_68,local_58[0] + 1);
                        }
                        paVar6 = this->out->mMetaData;
                        local_68 = local_58;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_68,"FrameRate","");
                        pFVar3 = (this->doc->globals)._M_t.
                                 super___uniq_ptr_impl<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_Assimp::FBX::FileGlobalSettings_*,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                                 .super__Head_base<0UL,_Assimp::FBX::FileGlobalSettings_*,_false>.
                                 _M_head_impl;
                        if (pFVar3 != (FileGlobalSettings *)0x0) {
                          FVar5 = FileGlobalSettings::TimeMode(pFVar3);
                          uVar16 = local_60;
                          if ((0xb < paVar6->mNumProperties) && (local_60 != 0)) {
                            if (local_60 < 0x400) {
                              paVar7 = paVar6->mKeys;
                              paVar7[0xb].length = (ai_uint32)local_60;
                              memcpy(paVar7[0xb].data,local_68,local_60);
                              paVar7[0xb].data[uVar16] = '\0';
                            }
                            paVar6->mValues[0xb].mType = AI_INT32;
                            pFVar12 = (FrameRate *)operator_new(4);
                            *pFVar12 = FVar5;
                            paVar6->mValues[0xb].mData = pFVar12;
                          }
                          if (local_68 != local_58) {
                            operator_delete(local_68,local_58[0] + 1);
                          }
                          paVar6 = this->out->mMetaData;
                          local_68 = local_58;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_68,"TimeSpanStart","");
                          pFVar3 = (this->doc->globals)._M_t.
                                   super___uniq_ptr_impl<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_Assimp::FBX::FileGlobalSettings_*,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                                   .super__Head_base<0UL,_Assimp::FBX::FileGlobalSettings_*,_false>.
                                   _M_head_impl;
                          if (pFVar3 != (FileGlobalSettings *)0x0) {
                            uVar13 = FileGlobalSettings::TimeSpanStart(pFVar3);
                            uVar16 = local_60;
                            if ((0xc < paVar6->mNumProperties) && (local_60 != 0)) {
                              if (local_60 < 0x400) {
                                paVar7 = paVar6->mKeys;
                                paVar7[0xc].length = (ai_uint32)local_60;
                                memcpy(paVar7[0xc].data,local_68,local_60);
                                paVar7[0xc].data[uVar16] = '\0';
                              }
                              paVar6->mValues[0xc].mType = AI_UINT64;
                              puVar14 = (uint64_t *)operator_new(8);
                              *puVar14 = uVar13;
                              paVar6->mValues[0xc].mData = puVar14;
                            }
                            if (local_68 != local_58) {
                              operator_delete(local_68,local_58[0] + 1);
                            }
                            paVar6 = this->out->mMetaData;
                            local_68 = local_58;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_68,"TimeSpanStop","");
                            pFVar3 = (this->doc->globals)._M_t.
                                     super___uniq_ptr_impl<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_Assimp::FBX::FileGlobalSettings_*,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                                     .
                                     super__Head_base<0UL,_Assimp::FBX::FileGlobalSettings_*,_false>
                                     ._M_head_impl;
                            if (pFVar3 != (FileGlobalSettings *)0x0) {
                              uVar13 = FileGlobalSettings::TimeSpanStop(pFVar3);
                              uVar16 = local_60;
                              if ((0xd < paVar6->mNumProperties) && (local_60 != 0)) {
                                if (local_60 < 0x400) {
                                  paVar7 = paVar6->mKeys;
                                  paVar7[0xd].length = (ai_uint32)local_60;
                                  memcpy(paVar7[0xd].data,local_68,local_60);
                                  paVar7[0xd].data[uVar16] = '\0';
                                }
                                paVar6->mValues[0xd].mType = AI_UINT64;
                                puVar14 = (uint64_t *)operator_new(8);
                                *puVar14 = uVar13;
                                paVar6->mValues[0xd].mData = puVar14;
                              }
                              if (local_68 != local_58) {
                                operator_delete(local_68,local_58[0] + 1);
                              }
                              paVar6 = this->out->mMetaData;
                              local_68 = local_58;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_68,"CustomFrameRate","");
                              pFVar3 = (this->doc->globals)._M_t.
                                       super___uniq_ptr_impl<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_Assimp::FBX::FileGlobalSettings_*,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                                       .
                                       super__Head_base<0UL,_Assimp::FBX::FileGlobalSettings_*,_false>
                                       ._M_head_impl;
                              if (pFVar3 != (FileGlobalSettings *)0x0) {
                                fVar17 = FileGlobalSettings::CustomFrameRate(pFVar3);
                                if ((0xe < paVar6->mNumProperties) && (local_60 != 0)) {
                                  local_48._0_4_ = fVar17;
                                  if (local_60 < 0x400) {
                                    paVar7 = paVar6->mKeys;
                                    paVar7[0xe].length = (ai_uint32)local_60;
                                    memcpy(paVar7[0xe].data,local_68,local_60);
                                    paVar7[0xe].data[local_60] = '\0';
                                  }
                                  paVar6->mValues[0xe].mType = AI_FLOAT;
                                  puVar10 = (undefined4 *)operator_new(4);
                                  *puVar10 = local_48._0_4_;
                                  paVar6->mValues[0xe].mData = puVar10;
                                }
                                if (local_68 == local_58) {
                                  return;
                                }
                                operator_delete(local_68,local_58[0] + 1);
                                return;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("globals.get()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXDocument.h"
                ,0x44d,"const FileGlobalSettings &Assimp::FBX::Document::GlobalSettings() const");
}

Assistant:

void FBXConverter::ConvertGlobalSettings() {
            if (nullptr == out) {
                return;
            }

            out->mMetaData = aiMetadata::Alloc(15);
            out->mMetaData->Set(0, "UpAxis", doc.GlobalSettings().UpAxis());
            out->mMetaData->Set(1, "UpAxisSign", doc.GlobalSettings().UpAxisSign());
            out->mMetaData->Set(2, "FrontAxis", doc.GlobalSettings().FrontAxis());
            out->mMetaData->Set(3, "FrontAxisSign", doc.GlobalSettings().FrontAxisSign());
            out->mMetaData->Set(4, "CoordAxis", doc.GlobalSettings().CoordAxis());
            out->mMetaData->Set(5, "CoordAxisSign", doc.GlobalSettings().CoordAxisSign());
            out->mMetaData->Set(6, "OriginalUpAxis", doc.GlobalSettings().OriginalUpAxis());
            out->mMetaData->Set(7, "OriginalUpAxisSign", doc.GlobalSettings().OriginalUpAxisSign());
            out->mMetaData->Set(8, "UnitScaleFactor", (double)doc.GlobalSettings().UnitScaleFactor());
            out->mMetaData->Set(9, "OriginalUnitScaleFactor", doc.GlobalSettings().OriginalUnitScaleFactor());
            out->mMetaData->Set(10, "AmbientColor", doc.GlobalSettings().AmbientColor());
            out->mMetaData->Set(11, "FrameRate", (int)doc.GlobalSettings().TimeMode());
            out->mMetaData->Set(12, "TimeSpanStart", doc.GlobalSettings().TimeSpanStart());
            out->mMetaData->Set(13, "TimeSpanStop", doc.GlobalSettings().TimeSpanStop());
            out->mMetaData->Set(14, "CustomFrameRate", doc.GlobalSettings().CustomFrameRate());
        }